

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  void **ppvVar1;
  uint *puVar2;
  uint uVar3;
  uv_stdio_container_t *puVar4;
  long lVar5;
  int iVar6;
  __pid_t __pid;
  __pid_t _Var7;
  int iVar8;
  int iVar9;
  int (*pipes) [2];
  long *plVar10;
  int *piVar11;
  ssize_t sVar12;
  uint stdio_count;
  long lVar13;
  ulong uVar14;
  int (*fds) [2];
  ulong uVar15;
  long lVar16;
  int signal_pipe [2];
  int status;
  int pipes_storage [8] [2];
  sigset_t signewset;
  undefined8 local_1a0;
  ulong local_198;
  int local_190;
  int local_18c;
  void **local_188;
  uv_process_t *local_180;
  int local_178 [18];
  __sigset_t local_130;
  sigset_t local_b0;
  
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/process.c"
                  ,0x3b6,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x7f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_HIDE_CONSOLE | UV_PROCESS_WINDOWS_HIDE_GUI | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/process.c"
                  ,0x3bd,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 8;
  process->handle_queue[0] = loop->handle_queue;
  plVar10 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar10;
  *plVar10 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  ppvVar1 = process->queue;
  process->queue[0] = ppvVar1;
  process->queue[1] = ppvVar1;
  process->status = 0;
  uVar3 = options->stdio_count;
  stdio_count = 3;
  if (3 < (int)uVar3) {
    stdio_count = uVar3;
  }
  uVar14 = (ulong)stdio_count;
  if ((int)uVar3 < 9) {
    pipes = (int (*) [2])local_178;
  }
  else {
    pipes = (int (*) [2])uv__malloc(uVar14 * 8);
    if (pipes == (int (*) [2])0x0) {
      return -0xc;
    }
  }
  local_198 = uVar14;
  local_188 = ppvVar1;
  local_180 = process;
  memset(pipes,0xff,uVar14 * 8);
  if (0 < options->stdio_count) {
    lVar13 = 8;
    lVar16 = 0;
    fds = pipes;
    do {
      puVar4 = options->stdio;
      uVar3 = *(uint *)((long)puVar4 + lVar13 + -8);
      switch(uVar3 & 7) {
      case 0:
        break;
      case 1:
        lVar5 = *(long *)((long)&puVar4->flags + lVar13);
        if (lVar5 == 0) {
          __assert_fail("container->data.stream != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/process.c"
                        ,0xb0,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
        }
        if (*(int *)(lVar5 + 0x10) != 7) {
LAB_00114e1a:
          iVar9 = -0x16;
          uVar14 = local_198;
          goto LAB_00114e24;
        }
        iVar9 = uv_socketpair(1,0,*fds,0,0);
        uVar14 = local_198;
        if (iVar9 != 0) goto LAB_00114e24;
        break;
      case 2:
      case 4:
        plVar10 = (long *)((long)&puVar4->flags + lVar13);
        if ((uVar3 & 2) == 0) {
          plVar10 = (long *)(*plVar10 + 0xb8);
        }
        if ((int)*plVar10 == -1) goto LAB_00114e1a;
        (*fds)[1] = (int)*plVar10;
        break;
      default:
        __assert_fail("0 && \"Unexpected flags\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/process.c"
                      ,0xc4,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
      }
      lVar16 = lVar16 + 1;
      fds = fds + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar16 < options->stdio_count);
  }
  uv_signal_start(&loop->child_watcher,uv__chld,0x11);
  local_1a0 = 0xffffffffffffffff;
  iVar6 = uv__make_pipe((int *)&local_1a0,0);
  if (iVar6 == 0) {
    uv_rwlock_wrlock(&loop->cloexec_lock);
    iVar9 = local_1a0._4_4_;
    sigfillset(&local_b0);
    sigdelset(&local_b0,9);
    sigdelset(&local_b0,0x13);
    sigdelset(&local_b0,5);
    sigdelset(&local_b0,0xb);
    sigdelset(&local_b0,7);
    sigdelset(&local_b0,4);
    sigdelset(&local_b0,0x1f);
    sigdelset(&local_b0,6);
    iVar6 = pthread_sigmask(0,&local_b0,&local_130);
    if (iVar6 != 0) {
LAB_0011507a:
      abort();
    }
    __pid = fork();
    if (__pid == 0) {
      uv__process_child_init(options,stdio_count,pipes,iVar9);
      goto LAB_0011510d;
    }
    iVar6 = 0;
    iVar9 = pthread_sigmask(2,&local_130,(__sigset_t *)0x0);
    if (iVar9 != 0) goto LAB_0011507a;
    if (__pid == -1) {
      piVar11 = __errno_location();
      iVar6 = -*piVar11;
    }
    uv_rwlock_wrunlock(&loop->cloexec_lock);
    uv__close(local_1a0._4_4_);
    if (iVar6 != 0) goto LAB_00114dfe;
    do {
      sVar12 = read((int)local_1a0,&local_190,4);
      if (sVar12 != -1) {
        if (sVar12 == 0) {
          uv__close_nocheckstdio((int)local_1a0);
          goto LAB_00114f41;
        }
        if (sVar12 != 4) goto LAB_0011507a;
        goto LAB_00114efd;
      }
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    if (*piVar11 != 0x20) goto LAB_0011507a;
    do {
      _Var7 = waitpid(__pid,&local_18c,0);
      if (_Var7 != -1) break;
    } while (*piVar11 == 4);
    if (_Var7 != __pid) {
      __assert_fail("err == *pid",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/process.c"
                    ,0x39c,
                    "int uv__spawn_and_init_child(uv_loop_t *, const uv_process_options_t *, int, int (*)[2], pid_t *)"
                   );
    }
    uv__close_nocheckstdio((int)local_1a0);
    iVar6 = -0x20;
  }
  goto LAB_00114f99;
joined_r0x00115049:
  for (; lVar13 != 0; lVar13 = lVar13 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar13) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar13 + -8));
    }
  }
LAB_00114e24:
  uVar15 = 0;
  do {
    if (((long)options->stdio_count <= (long)uVar15) ||
       ((options->stdio[uVar15].flags & (UV_INHERIT_STREAM|UV_INHERIT_FD)) == UV_IGNORE)) {
      if (pipes[uVar15][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar15][0]);
      }
      if (pipes[uVar15][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar15][1]);
      }
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != uVar14);
  goto LAB_0011501b;
  while (piVar11 = __errno_location(), *piVar11 == 4) {
LAB_00114efd:
    _Var7 = waitpid(__pid,&local_18c,0);
    if (_Var7 != -1) break;
  }
  iVar6 = local_190;
  if (_Var7 != __pid) {
LAB_0011510d:
    __assert_fail("err == *pid",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/process.c"
                  ,0x395,
                  "int uv__spawn_and_init_child(uv_loop_t *, const uv_process_options_t *, int, int (*)[2], pid_t *)"
                 );
  }
LAB_00114dfe:
  uv__close_nocheckstdio((int)local_1a0);
  if (iVar6 == 0) {
LAB_00114f41:
    local_180->pid = __pid;
    local_180->exit_cb = options->exit_cb;
    local_180->queue[0] = loop->process_handles;
    plVar10 = (long *)loop->process_handles[1];
    local_180->queue[1] = plVar10;
    *plVar10 = (long)local_188;
    loop->process_handles[1] = local_188;
    uVar3 = local_180->flags;
    iVar6 = 0;
    if (((uVar3 & 4) == 0) && (local_180->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
      puVar2 = &local_180->loop->active_handles;
      *puVar2 = *puVar2 + 1;
    }
  }
LAB_00114f99:
  iVar8 = options->stdio_count;
  iVar9 = iVar6;
  if (0 < iVar8) {
    lVar13 = 0;
    lVar16 = 0;
    do {
      puVar4 = options->stdio;
      if (((*(byte *)((long)&puVar4->flags + lVar13) & 1) != 0) && (-1 < pipes[lVar16][0])) {
        iVar9 = uv__close(pipes[lVar16][1]);
        if (iVar9 != 0) goto LAB_0011507a;
        pipes[lVar16][1] = -1;
        uv__nonblock_ioctl(pipes[lVar16][0],1);
        uVar3 = *(uint *)((long)&puVar4->flags + lVar13);
        iVar9 = uv__stream_open(*(uv_stream_t **)((long)&puVar4->data + lVar13),pipes[lVar16][0],
                                (uVar3 & 0x10) << 0xb | (uVar3 & 0x20) << 9);
        uVar14 = local_198;
        if (iVar9 != 0) goto joined_r0x00115049;
        iVar8 = options->stdio_count;
      }
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 0x10;
      iVar9 = iVar6;
    } while (lVar16 < iVar8);
  }
LAB_0011501b:
  if (pipes != (int (*) [2])local_178) {
    uv__free(pipes);
  }
  return iVar9;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return UV_ENOSYS;
#else
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_HIDE_CONSOLE |
                              UV_PROCESS_WINDOWS_HIDE_GUI |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);
  process->status = 0;

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

#ifdef UV_USE_SIGCHLD
  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);
#endif

  /* Spawn the child */
  exec_errorno = uv__spawn_and_init_child(loop, options, stdio_count, pipes, &pid);

#if 0
  /* This runs into a nodejs issue (it expects initialized streams, even if the
   * exec failed).
   * See https://github.com/libuv/libuv/pull/3107#issuecomment-782482608 */
  if (exec_errorno != 0)
      goto error;
#endif

  /* Activate this handle if exec() happened successfully, even if we later
   * fail to open a stdio handle. This ensures we can eventually reap the child
   * with waitpid. */
  if (exec_errorno == 0) {
#ifndef UV_USE_SIGCHLD
    struct kevent event;
    EV_SET(&event, pid, EVFILT_PROC, EV_ADD | EV_ONESHOT, NOTE_EXIT, 0, 0);
    if (kevent(loop->backend_fd, &event, 1, NULL, 0, NULL)) {
      if (errno != ESRCH)
        abort();
      /* Process already exited. Call waitpid on the next loop iteration. */
      process->flags |= UV_HANDLE_REAP;
      loop->flags |= UV_LOOP_REAP_CHILDREN;
    }
#endif

    process->pid = pid;
    process->exit_cb = options->exit_cb;
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}